

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
getShaderInitialization_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType)

{
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  char *pcVar3;
  ostringstream source;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar2 = (int)ctx;
  if (bVar1) {
    if (2 < iVar2 - 2U) goto LAB_013663fa;
    pcVar3 = &DAT_018ca9b0 + *(int *)(&DAT_018ca9b0 + (ulong)(iVar2 - 2U) * 4);
  }
  else if (iVar2 == 2) {
    std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                    "#extension GL_EXT_geometry_shader : enable\n");
    pcVar3 = "layout(max_vertices = 5) out;\n";
  }
  else if (iVar2 == 3) {
    std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                    "#extension GL_EXT_tessellation_shader : enable\n");
    pcVar3 = "layout(vertices = 3) out;\n";
  }
  else {
    if (iVar2 != 4) goto LAB_013663fa;
    std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                    "#extension GL_EXT_tessellation_shader : enable\n");
    pcVar3 = "layout(triangles, equal_spacing, cw) in;\n";
  }
  std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3);
LAB_013663fa:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderInitialization (NegativeTestContext& ctx, glu::ShaderType shaderType)
{
	std::ostringstream source;

	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_GEOMETRY:
				source << "#extension GL_EXT_geometry_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_CONTROL:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_EVALUATION:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			default:
				break;
		}
	}

	switch (shaderType)
	{
		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(max_vertices = 5) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "layout(vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "layout(triangles, equal_spacing, cw) in;\n";
			break;

		default:
			break;
	}

	return source.str();
}